

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

int listincludes(char *list,char *needle,int needlelen)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *end;
  char *start;
  char *s;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = needle;
  local_38 = list;
  bVar1 = parselist(&local_38,&local_48,&local_50,&listquotestart,&listquoteend);
  if (bVar1) {
    iVar3 = 0;
    do {
      iVar2 = (int)local_50 - (int)local_48;
      if ((iVar2 == needlelen) && (iVar2 = strncmp(local_40,local_48,(long)iVar2), iVar2 == 0)) {
        return iVar3;
      }
      iVar3 = iVar3 + 1;
      bVar1 = parselist(&local_38,&local_48,&local_50,&listquotestart,&listquoteend);
    } while (bVar1);
  }
  return -1;
}

Assistant:

int listincludes(const char *list, const char *needle, int needlelen)
{
    int offset = 0;
    for(const char *s = list, *start, *end; parselist(s, start, end);)
    {
        int len = end - start;
        if(needlelen == len && !strncmp(needle, start, len)) return offset;
        offset++;
    }
    return -1;
}